

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.cpp
# Opt level: O0

void __thiscall
SCCTest_SingletonLoop_Test::~SCCTest_SingletonLoop_Test(SCCTest_SingletonLoop_Test *this)

{
  SCCTest_SingletonLoop_Test *this_local;
  
  ~SCCTest_SingletonLoop_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SCCTest, SingletonLoop) {
  // Same as above, but now there is an edge. The results are the same.
  Graph graph(1);
  graph.addEdge(0, 0);
  GraphSCCs sccs(graph);

  auto it = sccs.begin();
  ASSERT_NE(it, sccs.end());

  auto scc = *it;
  auto sccIt = scc.begin();
  ASSERT_NE(sccIt, scc.end());
  EXPECT_EQ(*sccIt, 0u);

  ++sccIt;
  EXPECT_EQ(sccIt, scc.end());
  ASSERT_NE(it, sccs.end());

  ++it;
  EXPECT_EQ(it, sccs.end());

  EXPECT_EQ(getSCCs(graph), SCCSet{{0}});
}